

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

int NULLCPugiXML::xml_document__save_file
              (NULLCArray name,NULLCArray indent,int flags,xml_encoding encoding,
              xml_document *document)

{
  xml_document *this;
  bool bVar1;
  xml_document *doc;
  xml_encoding encoding_local;
  int flags_local;
  NULLCArray indent_local;
  NULLCArray name_local;
  
  if (document->impl == (xml_document_impl *)0x0) {
    nullcThrowError("xml_document constructor wasn\'t called");
    name_local.ptr._4_4_ = 0;
  }
  else {
    this = document->impl->document;
    if (this == (xml_document *)0x0) {
      nullcThrowError("xml_document::save document is empty, you must create document first");
      name_local.ptr._4_4_ = 0;
    }
    else {
      bVar1 = pugi::xml_document::save_file(this,name.ptr,indent.ptr,flags,encoding);
      name_local.ptr._4_4_ = (uint)bVar1;
    }
  }
  return name_local.ptr._4_4_;
}

Assistant:

int xml_document__save_file(NULLCArray name, NULLCArray indent, int flags, pugi::xml_encoding encoding, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return 0; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			nullcThrowError("xml_document::save document is empty, you must create document first");
			return 0;
		}
		return doc->save_file(name.ptr, indent.ptr, flags, encoding);
	}